

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

TRef lj_ir_kint(jit_State *J,int32_t k)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  uint uVar4;
  ulong uVar5;
  
  pIVar2 = (J->cur).ir;
  pIVar3 = J->chain + 0x17;
  do {
    uVar1 = *pIVar3;
    uVar4 = (uint)uVar1;
    if ((ulong)uVar1 == 0) {
      uVar4 = (J->cur).nk;
      if (uVar4 <= J->irbotlim) {
        lj_ir_growbot(J);
        pIVar2 = (J->cur).ir;
      }
      uVar4 = uVar4 - 1;
      uVar5 = (ulong)uVar4;
      (J->cur).nk = uVar4;
      pIVar2[uVar5].i = k;
      *(undefined2 *)((long)pIVar2 + uVar5 * 8 + 4) = 0x1713;
      *(IRRef1 *)((long)pIVar2 + uVar5 * 8 + 6) = J->chain[0x17];
      J->chain[0x17] = (IRRef1)uVar4;
      break;
    }
    pIVar3 = &pIVar2[uVar1].field_0.prev;
  } while (pIVar2[uVar1].field_1.op12 != k);
  return uVar4 + 0x13000000;
}

Assistant:

TRef LJ_FASTCALL lj_ir_kint(jit_State *J, int32_t k)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  for (ref = J->chain[IR_KINT]; ref; ref = cir[ref].prev)
    if (cir[ref].i == k)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->i = k;
  ir->t.irt = IRT_INT;
  ir->o = IR_KINT;
  ir->prev = J->chain[IR_KINT];
  J->chain[IR_KINT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_INT);
}